

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcCrossProductsStates
          (BeagleCPUImpl<double,_1,_0> *this,int *tipStates,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  pointer pdVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int j;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  vector<double,_std::allocator<double>_> tmp;
  allocator_type local_89;
  BeagleCPUImpl<double,_1,_0> *local_88;
  long local_80;
  double *local_78;
  double local_70;
  double *local_68;
  double *local_60;
  int *local_58;
  value_type_conflict local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  if (0 < this->kPatternCount) {
    lVar16 = 0;
    local_80 = 0;
    local_88 = this;
    local_78 = preOrderPartial;
    local_70 = edgeLength;
    local_68 = categoryRates;
    local_60 = categoryWeights;
    local_58 = tipStates;
    do {
      local_50 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48,(ulong)(uint)(local_88->kStateCount * local_88->kStateCount),&local_50,
                 &local_89);
      lVar12 = (long)local_58[lVar16];
      uVar8 = local_88->kStateCount;
      uVar11 = (ulong)uVar8;
      uVar9 = local_88->kCategoryCount;
      if (local_58[lVar16] < (int)uVar8) {
        if ((int)uVar9 < 1) {
          dVar32 = 0.0;
        }
        else {
          iVar10 = local_88->kPatternCount;
          lVar14 = (long)local_88->kPartialsPaddedStateCount;
          auVar24 = ZEXT816(0);
          uVar17 = 0;
          pdVar15 = (double *)(local_80 * lVar14 + (long)local_78);
          do {
            dVar2 = local_60[uVar17];
            auVar23._8_8_ = 0;
            auVar23._0_8_ = dVar2;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_78[lVar12 + (uVar17 * (long)iVar10 + lVar16) * lVar14];
            auVar24 = vfmadd231sd_fma(auVar24,auVar23,auVar3);
            dVar32 = auVar24._0_8_;
            if (0 < (int)uVar8) {
              uVar19 = 0;
              dVar33 = local_68[uVar17];
              pdVar13 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar12;
              do {
                pdVar1 = pdVar15 + uVar19;
                uVar19 = uVar19 + 1;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = *pdVar13;
                auVar27._8_8_ = 0;
                auVar27._0_8_ = local_70 * dVar33;
                auVar29._8_8_ = 0;
                auVar29._0_8_ = dVar2 * *pdVar1;
                auVar34 = vfmadd213sd_fma(auVar29,auVar27,auVar4);
                *pdVar13 = auVar34._0_8_;
                pdVar13 = pdVar13 + (int)uVar8;
              } while (uVar11 != uVar19);
            }
            uVar17 = uVar17 + 1;
            pdVar15 = pdVar15 + iVar10 * lVar14;
          } while (uVar17 != uVar9);
        }
        if (0 < (int)uVar8) {
          lVar12 = lVar12 << 3;
          lVar14 = uVar11 * 8;
          auVar21._0_8_ = local_88->gPatternWeights[lVar16] / dVar32;
          auVar21._8_8_ = 0;
          do {
            auVar25._8_8_ = 0;
            auVar25._0_8_ =
                 *(ulong *)((long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar12);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)((long)outCrossProducts + lVar12);
            auVar24 = vfmadd213sd_fma(auVar25,auVar21,auVar6);
            *(long *)((long)outCrossProducts + lVar12) = auVar24._0_8_;
            lVar12 = lVar12 + lVar14;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
          goto LAB_001299ec;
        }
LAB_001299e7:
        if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_001299ec;
      }
      else {
        if ((int)uVar9 < 1) {
          dVar32 = 0.0;
        }
        else {
          lVar12 = (long)local_88->kPartialsPaddedStateCount;
          iVar10 = local_88->kPatternCount;
          auVar31 = ZEXT864(0) << 0x40;
          uVar17 = 0;
          pdVar15 = (double *)(local_80 * lVar12 + (long)local_78);
          do {
            dVar32 = local_60[uVar17];
            auVar24._8_8_ = 0;
            auVar24._0_8_ = dVar32;
            if ((int)uVar8 < 1) {
              auVar24 = vfmadd213sd_fma(auVar24,ZEXT816(0) << 0x40,auVar31._0_16_);
            }
            else {
              dVar33 = 0.0;
              dVar2 = local_68[uVar17];
              uVar19 = 0;
              do {
                dVar33 = dVar33 + pdVar15[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar11 != uVar19);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = dVar33;
              auVar24 = vfmadd213sd_fma(auVar34,auVar24,auVar31._0_16_);
              if (0 < (int)uVar8) {
                uVar18 = 0;
                uVar19 = 0;
                do {
                  uVar20 = 0;
                  do {
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = local_48.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar18 + uVar20];
                    auVar28._8_8_ = 0;
                    auVar28._0_8_ = local_70 * dVar2;
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ =
                         dVar32 * local_78[(uVar17 * (long)iVar10 + lVar16) * lVar12 + uVar19];
                    auVar34 = vfmadd213sd_fma(auVar30,auVar28,auVar5);
                    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar18 + uVar20] = auVar34._0_8_;
                    uVar20 = uVar20 + 1;
                  } while (uVar11 != uVar20);
                  uVar19 = uVar19 + 1;
                  uVar18 = (ulong)((int)uVar18 + uVar8);
                } while (uVar19 != uVar11);
              }
            }
            dVar32 = auVar24._0_8_;
            uVar17 = uVar17 + 1;
            pdVar15 = pdVar15 + iVar10 * lVar12;
            auVar31 = ZEXT1664(auVar24);
          } while (uVar17 != uVar9);
        }
        if ((int)uVar8 < 1) goto LAB_001299e7;
        uVar17 = 0;
        auVar22._0_8_ = local_88->gPatternWeights[lVar16] / dVar32;
        auVar22._8_8_ = 0;
        pdVar13 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar15 = outCrossProducts;
        do {
          uVar19 = 0;
          do {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = pdVar13[uVar19];
            auVar7._8_8_ = 0;
            auVar7._0_8_ = pdVar15[uVar19];
            auVar24 = vfmadd213sd_fma(auVar26,auVar22,auVar7);
            pdVar15[uVar19] = auVar24._0_8_;
            uVar19 = uVar19 + 1;
          } while (uVar11 != uVar19);
          uVar17 = uVar17 + 1;
          pdVar15 = pdVar15 + uVar11;
          pdVar13 = pdVar13 + uVar11;
        } while (uVar17 != uVar11);
LAB_001299ec:
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_80 = local_80 + 8;
      lVar16 = lVar16 + 1;
    } while (lVar16 < local_88->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    tmp[k * kStateCount + state] += preOrderPartial[v + k] * weight * scale;
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                outCrossProducts[k * kStateCount + state] += tmp[k * kStateCount + state] * patternWeight;
            }

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < kStateCount; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    for (int j = 0; j < kStateCount; j++) {
                        tmp[k * kStateCount + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
                }
            }
        }
    }
}